

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car.cpp
# Opt level: O0

int __thiscall Car::get_ypos(Car *this)

{
  int iVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lck;
  Car *this_local;
  
  lck._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mtx);
  iVar1 = this->_ypos;
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return iVar1;
}

Assistant:

int Car::get_ypos(){
         std::lock_guard lck(mtx);
         return _ypos;
    }